

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O1

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_3,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
           *kernel)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  double *pdVar4;
  SrcEvaluatorType *pSVar5;
  double *pdVar6;
  type pMVar7;
  double *pdVar8;
  long lVar9;
  double dVar10;
  ulong uVar11;
  Index row;
  long lVar12;
  
  uVar3 = (kernel->m_dstExpr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
          m_storage.m_rows;
  uVar11 = uVar3 - ((long)uVar3 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar3) {
    lVar12 = 0;
    do {
      pdVar4 = (kernel->m_dst->
               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>).
               m_d.data;
      pdVar6 = (kernel->m_src->
               super_product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               ).m_lhsImpl.
               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d
               .data + lVar12;
      dVar10 = pdVar6[1];
      dVar1 = *(kernel->m_src->
               super_product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               ).m_rhsImpl.
               super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
               super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
               .m_data;
      pdVar8 = pdVar4 + lVar12;
      dVar2 = pdVar8[1];
      pdVar4 = pdVar4 + lVar12;
      *pdVar4 = dVar1 * *pdVar6 + *pdVar8;
      pdVar4[1] = dVar1 * dVar10 + dVar2;
      lVar12 = lVar12 + 2;
    } while (lVar12 < (long)uVar11);
  }
  if ((long)uVar11 < (long)uVar3) {
    if ((long)uVar3 < -1) {
LAB_001432ef:
      __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                    ,0x7a,
                    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, 1, 1>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = 1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    pSVar5 = kernel->m_src;
    pdVar6 = (kernel->m_dst->
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>).m_d.
             data;
    pMVar7 = (pSVar5->
             super_product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             ).m_lhs;
    pdVar8 = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    lVar12 = (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    do {
      if (lVar12 <= (long)uVar11) goto LAB_001432ef;
      pdVar4 = (pSVar5->
               super_product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
               ).m_rhs.
               super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
               m_data;
      lVar9 = (pSVar5->
              super_product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              ).m_rhs.
              super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
              m_rows.m_value;
      if (lVar9 < 0 && pdVar4 != (double *)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                      ,0xb2,
                      "Eigen::MapBase<Eigen::Block<const Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, -1, 1, true>, Level = 0]"
                     );
      }
      if (lVar9 != 1) {
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseBinaryOp.h"
                      ,0x74,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<double, -1, 1>, 1, 1>>, const Eigen::Block<const Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, -1, 1, true>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<double, -1, 1>, 1, 1>>, Rhs = const Eigen::Block<const Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, -1, 1, true>]"
                     );
      }
      pdVar6[uVar11] = pdVar8[uVar11] * *pdVar4 + pdVar6[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar3 != uVar11);
  }
  return;
}

Assistant:

Index size() const EIGEN_NOEXCEPT { return m_dstExpr.size(); }